

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::AppendCustomCommandSideEffects
          (cmGeneratorTarget *this,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *sideEffects)

{
  pointer pAVar1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar2;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *pvVar3;
  cmCustomCommand *pcVar4;
  pointer pAVar5;
  cmGeneratorTarget *local_28;
  
  pvVar2 = GetPreBuildCommands(this);
  if ((((pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
        super__Vector_impl_data._M_finish) &&
      (pvVar2 = GetPreLinkCommands(this),
      (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
      super__Vector_impl_data._M_finish)) &&
     (pvVar2 = GetPostBuildCommands(this),
     (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
     super__Vector_impl_data._M_start ==
     (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    pvVar3 = GetAllConfigSources(this);
    pAVar5 = (pvVar3->
             super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pAVar1 = (pvVar3->
             super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pAVar5 == pAVar1) {
        return;
      }
      pcVar4 = cmSourceFile::GetCustomCommand(pAVar5->Source);
      pAVar5 = pAVar5 + 1;
    } while (pcVar4 == (cmCustomCommand *)0x0);
  }
  local_28 = this;
  std::
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  ::_M_insert_unique<cmGeneratorTarget_const*>
            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              *)sideEffects,&local_28);
  return;
}

Assistant:

void cmGeneratorTarget::AppendCustomCommandSideEffects(
  std::set<cmGeneratorTarget const*>& sideEffects) const
{
  if (!this->GetPreBuildCommands().empty() ||
      !this->GetPreLinkCommands().empty() ||
      !this->GetPostBuildCommands().empty()) {
    sideEffects.insert(this);
  } else {
    for (auto const& source : this->GetAllConfigSources()) {
      if (source.Source->GetCustomCommand() != nullptr) {
        sideEffects.insert(this);
        break;
      }
    }
  }
}